

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlator.cc
# Opt level: O0

char * decoder::correlationTypeToString(correlationType t)

{
  correlationType t_local;
  char *local_8;
  
  switch(t) {
  case LRIT_PHASE_000:
    local_8 = "LRIT 0 deg";
    break;
  case LRIT_PHASE_180:
    local_8 = "LRIT 180 deg";
    break;
  case HRIT_PHASE_000:
    local_8 = "HRIT 0 deg";
    break;
  case HRIT_PHASE_180:
    local_8 = "HRIT 180 deg";
    break;
  default:
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char* correlationTypeToString(correlationType t) {
  switch (t) {
  case LRIT_PHASE_000:
    return "LRIT 0 deg";
  case LRIT_PHASE_180:
    return "LRIT 180 deg";
  case HRIT_PHASE_000:
    return "HRIT 0 deg";
  case HRIT_PHASE_180:
    return "HRIT 180 deg";
  }
  return "";
}